

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TessellationShaderMaxPatchVertices::iterate(TessellationShaderMaxPatchVertices *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  GLfloat outer [4];
  GLfloat inner [2];
  string local_58;
  undefined1 *local_38;
  long lVar7;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var,iVar4);
    initTest(this);
    (**(code **)(lVar7 + 0x1680))(this->m_po_id_1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glUseProgram() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x2fc);
    (**(code **)(lVar7 + 0x5e0))(0x8c89);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glEnable(RASTERIZER_DISCARD) failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x2ff);
    (**(code **)(lVar7 + 0xd0))(0x8e22,this->m_tf_id_1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindTransformFeedback() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x302);
    (**(code **)(lVar7 + 0x48))(0x8c8e,0,this->m_bo_id_f_1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindBufferRange() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x305);
    (**(code **)(lVar7 + 0x48))(0x8c8e,1,this->m_bo_id_i_1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindBufferRange() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x308);
    (**(code **)(lVar7 + 0x30))(0);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBeginTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x30c);
    (**(code **)(lVar7 + 0x538))
              ((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,this->m_gl_max_patch_vertices);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glDrawArrays() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x30f);
    (**(code **)(lVar7 + 0x638))();
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glEndTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x312);
    (**(code **)(lVar7 + 0x40))(0x8c8e,this->m_bo_id_f_1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindBuffer() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x318);
    bVar1 = compareResults(this,"Case 1 (explicit arrays)",this->m_ref_fv_case_1);
    (**(code **)(lVar7 + 0x40))(0x8c8e,this->m_bo_id_i_1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindBuffer() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x31e);
    bVar2 = compareResults(this,"Case 1 (explicit arrays)",this->m_ref_iv_case_1);
    bVar2 = bVar2 && bVar1;
    uVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar6 & 0x300) != 0) {
      (**(code **)(lVar7 + 0x1680))(this->m_po_id_2);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glUseProgram() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x329);
      (**(code **)(lVar7 + 0xd0))(0x8e22,this->m_tf_id_2);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBindTransformFeedback() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x32c);
      (**(code **)(lVar7 + 0x48))(0x8c8e,0,this->m_bo_id_f_2);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBindBufferRange() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x32f);
      (**(code **)(lVar7 + 0x48))(0x8c8e,1,this->m_bo_id_i_2);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBindBufferRange() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x332);
      local_38 = &DAT_3f8000003f800000;
      local_58._M_dataplus._M_p = &DAT_3f8000003f800000;
      local_58._M_string_length._0_4_ = 0x3f800000;
      local_58._M_string_length._4_4_ = 0x3f800000;
      (**(code **)(lVar7 + 0xfd0))(0x8e74);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glPatchParameterfv() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x339);
      (**(code **)(lVar7 + 0xfd0))(0x8e73,&local_38);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glPatchParameterfv() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x33c);
      (**(code **)(lVar7 + 0x30))(0);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBeginTransformFeedback(GL_POINTS) failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x340);
      (**(code **)(lVar7 + 0x538))(0xe,0,this->m_gl_max_patch_vertices);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glDrawArrays() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x343);
      (**(code **)(lVar7 + 0x638))();
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glEndTransformFeedback() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x346);
      (**(code **)(lVar7 + 0x40))(0x8c8e,this->m_bo_id_f_2);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBindBuffer() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x34a);
      bVar1 = compareResults(this,"Case 2 (implicit arrays)",this->m_ref_fv_case_2);
      (**(code **)(lVar7 + 0x40))(0x8c8e,this->m_bo_id_i_2);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBindBuffer() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x350);
      bVar3 = compareResults(this,"Case 2 (implicit arrays)",this->m_ref_iv_case_2);
      bVar2 = bVar2 && (bVar3 && bVar1);
    }
    if (bVar2) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Tessellation shader functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_58);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderMaxPatchVertices::iterate(void)
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Retrieve ES entry/state points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialization */
	initTest();

	/* Render setup case 1. */
	gl.useProgram(m_po_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed!");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(RASTERIZER_DISCARD) failed!");

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_tf_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback() failed!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_id_f_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, m_bo_id_i_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

	/* Rendering case 1 with transform feedback.*/
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");

	gl.drawArrays(m_glExtTokens.PATCHES, 0, m_gl_max_patch_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

	/* Compare vec4 results from transform feedback for case 1. */
	bool test_passed = true;

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_f_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	test_passed &= compareResults("Case 1 (explicit arrays)", m_ref_fv_case_1);

	/* Compare ivec4 results from transform feedback for case 2. */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_i_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	test_passed &= compareResults("Case 1 (explicit arrays)", m_ref_iv_case_1);

	// Case 2 tests with no TCS (default TCS is expected to be used).
	// Since this is not allowed by ES 3.1, just skip it.
	// Leaving the code for Desktop
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Set up rendering for case 2. */
		gl.useProgram(m_po_id_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed!");

		gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_tf_id_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback() failed!");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id_f_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1 /* index */, m_bo_id_i_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

		/* Tessellation Control Levels setup. */
		const glw::GLfloat inner[] = { 1.0, 1.0 };
		const glw::GLfloat outer[] = { 1.0, 1.0, 1.0, 1.0 };

		gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, outer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() failed!");

		gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, inner);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() failed!");

		/* Rendering case 2 with transform feedback. */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_POINTS) failed");

		gl.drawArrays(GL_PATCHES, 0, m_gl_max_patch_vertices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

		/* Compare vec4 results from transform feedback for case 2. */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_f_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

		test_passed &= compareResults("Case 2 (implicit arrays)", m_ref_fv_case_2);

		/* Compare ivec4 results from transform feedback for case 2. */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_i_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

		test_passed &= compareResults("Case 2 (implicit arrays)", m_ref_iv_case_2);
	}
	/* All done */
	if (test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}